

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<ProjectBuilderSubDirs_*>::relocate
          (QArrayDataPointer<ProjectBuilderSubDirs_*> *this,qsizetype offset,
          ProjectBuilderSubDirs ***data)

{
  ProjectBuilderSubDirs **d_first;
  ProjectBuilderSubDirs **ppPVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<ProjectBuilderSubDirs*,long_long>(this->ptr,this->size,d_first);
  if (data != (ProjectBuilderSubDirs ***)0x0) {
    ppPVar1 = *data;
    if ((this->ptr <= ppPVar1) && (ppPVar1 < this->ptr + this->size)) {
      *data = ppPVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }